

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

bool __thiscall
psy::C::TypeChecker::satisfyIntegerTypeConstraint(TypeChecker *this,Type *ty,SyntaxNode *node)

{
  bool bVar1;
  SyntaxToken SStack_58;
  
  bVar1 = isIntegerType(ty);
  if (!bVar1) {
    SyntaxNode::lastToken(&SStack_58,node);
    DiagnosticsReporter::ExpectedExpressionOfIntegerType(&this->diagReporter_,&SStack_58);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  return bVar1;
}

Assistant:

bool TypeChecker::satisfyIntegerTypeConstraint(const Type* ty, const SyntaxNode* node)
{
    if (!isIntegerType(ty)) {
        diagReporter_.ExpectedExpressionOfIntegerType(node->lastToken());
        return false;
    }
    return true;
}